

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdsample.c
# Opt level: O0

void h1v2_fancy_upsample(j_decompress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                        JSAMPARRAY *output_data_ptr)

{
  JSAMPARRAY ppJVar1;
  int v;
  int outrow;
  int inrow;
  JDIMENSION colctr;
  int bias;
  int thiscolsum;
  JSAMPROW outptr;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  JSAMPARRAY output_data;
  JSAMPARRAY *output_data_ptr_local;
  JSAMPARRAY input_data_local;
  jpeg_component_info *compptr_local;
  j_decompress_ptr cinfo_local;
  
  ppJVar1 = *output_data_ptr;
  outrow = 0;
  inrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    for (v = 0; v < 2; v = v + 1) {
      if (v == 0) {
        inptr1 = input_data[inrow + -1];
        bias = 1;
      }
      else {
        inptr1 = input_data[inrow + 1];
        bias = 2;
      }
      outptr = ppJVar1[outrow];
      inptr0 = input_data[inrow];
      for (colctr = 0; colctr < compptr->downsampled_width; colctr = colctr + 1) {
        *outptr = (JSAMPLE)((int)((uint)*inptr0 * 3 + (uint)*inptr1 + bias) >> 2);
        outptr = outptr + 1;
        inptr1 = inptr1 + 1;
        inptr0 = inptr0 + 1;
      }
      outrow = outrow + 1;
    }
    inrow = inrow + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
h1v2_fancy_upsample(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                    JSAMPARRAY input_data, JSAMPARRAY *output_data_ptr)
{
  JSAMPARRAY output_data = *output_data_ptr;
  JSAMPROW inptr0, inptr1, outptr;
#if BITS_IN_JSAMPLE == 8
  int thiscolsum, bias;
#else
  JLONG thiscolsum, bias;
#endif
  JDIMENSION colctr;
  int inrow, outrow, v;

  inrow = outrow = 0;
  while (outrow < cinfo->max_v_samp_factor) {
    for (v = 0; v < 2; v++) {
      /* inptr0 points to nearest input row, inptr1 points to next nearest */
      inptr0 = input_data[inrow];
      if (v == 0) {             /* next nearest is row above */
        inptr1 = input_data[inrow - 1];
        bias = 1;
      } else {                  /* next nearest is row below */
        inptr1 = input_data[inrow + 1];
        bias = 2;
      }
      outptr = output_data[outrow++];

      for (colctr = 0; colctr < compptr->downsampled_width; colctr++) {
        thiscolsum = (*inptr0++) * 3 + (*inptr1++);
        *outptr++ = (JSAMPLE)((thiscolsum + bias) >> 2);
      }
    }
    inrow++;
  }
}